

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListCreateImmediate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_queue_desc_t *altdesc,
          ze_command_list_handle_t *phCommandList)

{
  object_t<_ze_command_list_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnCommandListCreateImmediate_t pfnCreateImmediate;
  dditable_t *dditable;
  ze_command_list_handle_t *pp_Stack_30;
  ze_result_t result;
  ze_command_list_handle_t *phCommandList_local;
  ze_command_queue_desc_t *altdesc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnCreateImmediate = *(ze_pfnCommandListCreateImmediate_t *)(hContext + 8);
  if (*(code **)(pfnCreateImmediate + 0x218) == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDevice_local = *(ze_device_handle_t *)hContext;
    altdesc_local = *(ze_command_queue_desc_t **)hDevice;
    pp_Stack_30 = phCommandList;
    phCommandList_local = (ze_command_list_handle_t *)altdesc;
    dditable._4_4_ =
         (**(code **)(pfnCreateImmediate + 0x218))
                   (hDevice_local,altdesc_local,altdesc,phCommandList);
    hContext_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_command_list_handle_t*>,_ze_command_list_handle_t*>
               ::getInstance<_ze_command_list_handle_t*&,dditable_t*&>
                         (context,pp_Stack_30,(dditable_t **)&pfnCreateImmediate);
      *pp_Stack_30 = (ze_command_list_handle_t)poVar1;
      hContext_local._4_4_ = dditable._4_4_;
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreateImmediate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_queue_desc_t* altdesc,         ///< [in] pointer to command queue descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnCreateImmediate = dditable->ze.CommandList.pfnCreateImmediate;
        if( nullptr == pfnCreateImmediate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnCreateImmediate( hContext, hDevice, altdesc, phCommandList );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phCommandList = reinterpret_cast<ze_command_list_handle_t>(
                context->ze_command_list_factory.getInstance( *phCommandList, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }